

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dml.cpp
# Opt level: O1

void __thiscall dml::listRecords(dml *this,string *typeName,ostream *stream)

{
  pointer pcVar1;
  long lVar2;
  pointer prVar3;
  ostream *poVar4;
  pointer prVar5;
  ostream *this_00;
  _Base_ptr p_Var6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  undefined8 *puVar11;
  long *plVar12;
  ostream *poVar13;
  ulong uVar14;
  size_type *__nbytes;
  size_t __nbytes_00;
  void *__buf;
  void *__buf_00;
  int __fd;
  undefined8 uVar15;
  pointer prVar16;
  uint32_t uVar17;
  uint __len;
  int iVar18;
  page page;
  vector<record,_std::allocator<record>_> pageRecords;
  string __str;
  file file;
  fstream currFile;
  page local_378;
  long local_368;
  undefined8 uStack_360;
  undefined1 local_358 [24];
  long lStack_340;
  pointer *local_338;
  long local_330;
  pointer local_328 [2];
  uint local_314;
  file local_310;
  ulong *local_2d8;
  long local_2d0;
  ulong local_2c8 [2];
  string local_2b8;
  vector<record,_std::allocator<record>_> local_298;
  string local_280;
  ostream *local_260;
  _Base_ptr local_258;
  string *local_250;
  ulong local_248;
  fstream local_240 [528];
  
  local_250 = typeName;
  local_258 = (_Base_ptr)SystemCatalog::getType(this->systemCatalog,typeName);
  if ((_Rb_tree_header *)local_258 !=
      &(this->systemCatalog->types)._M_t._M_impl.super__Rb_tree_header) {
    local_298.super__Vector_base<record,_std::allocator<record>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_298.super__Vector_base<record,_std::allocator<record>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_298.super__Vector_base<record,_std::allocator<record>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar8 = (char)local_258[2]._M_color * '\x04' + 1;
    local_248 = (ulong)bVar8;
    uVar9 = (uint)(0x7fb / (ulong)(bVar8 + 1));
    local_314 = 0xff;
    if (uVar9 < 0xff) {
      local_314 = uVar9;
    }
    uVar17 = 1;
    local_260 = stream;
    do {
      local_2d8 = local_2c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"data/","");
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      pcVar1 = (local_250->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_280,pcVar1,pcVar1 + local_250->_M_string_length);
      truncateName(&local_2b8,&local_280);
      uVar14 = 0xf;
      if (local_2d8 != local_2c8) {
        uVar14 = local_2c8[0];
      }
      if (uVar14 < local_2b8._M_string_length + local_2d0) {
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          uVar15 = local_2b8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar15 < local_2b8._M_string_length + local_2d0) goto LAB_001075b8;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,(ulong)local_2d8);
      }
      else {
LAB_001075b8:
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_2d8,(ulong)local_2b8._M_dataplus._M_p);
      }
      local_378._0_8_ = &local_368;
      plVar12 = puVar11 + 2;
      if ((long *)*puVar11 == plVar12) {
        local_368 = *plVar12;
        uStack_360 = puVar11[3];
      }
      else {
        local_368 = *plVar12;
        local_378._0_8_ = (long *)*puVar11;
      }
      local_378.slots = (uint8_t *)puVar11[1];
      *puVar11 = plVar12;
      puVar11[1] = 0;
      *(undefined1 *)plVar12 = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_378);
      local_358._0_8_ = local_358 + 0x10;
      prVar16 = (pointer)(plVar12 + 2);
      if ((pointer)*plVar12 == prVar16) {
        local_358._16_8_ = *(undefined8 *)prVar16;
        lStack_340 = plVar12[3];
      }
      else {
        local_358._16_8_ = *(undefined8 *)prVar16;
        local_358._0_8_ = (pointer)*plVar12;
      }
      local_358._8_8_ = plVar12[1];
      *plVar12 = (long)prVar16;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      uVar9 = -uVar17;
      if (0 < (int)uVar17) {
        uVar9 = uVar17;
      }
      __len = 1;
      if (9 < uVar9) {
        uVar14 = (ulong)uVar9;
        uVar7 = 4;
        do {
          __len = uVar7;
          uVar10 = (uint)uVar14;
          if (uVar10 < 100) {
            __len = __len - 2;
            goto LAB_001076d5;
          }
          if (uVar10 < 1000) {
            __len = __len - 1;
            goto LAB_001076d5;
          }
          if (uVar10 < 10000) goto LAB_001076d5;
          uVar14 = uVar14 / 10000;
          uVar7 = __len + 4;
        } while (99999 < uVar10);
        __len = __len + 1;
      }
LAB_001076d5:
      local_338 = local_328;
      std::__cxx11::string::_M_construct
                ((ulong)&local_338,(char)__len - (char)((int)uVar17 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar17 >> 0x1f) + (long)local_338),__len,uVar9);
      p_Var6 = local_258;
      prVar16 = (pointer)0xf;
      if ((pointer)local_358._0_8_ != (pointer)(local_358 + 0x10)) {
        prVar16 = (pointer)local_358._16_8_;
      }
      if (prVar16 < (pointer)((uint8_t *)local_358._8_8_ + local_330)) {
        prVar16 = (pointer)0xf;
        if (local_338 != local_328) {
          prVar16 = local_328[0];
        }
        if (prVar16 < (pointer)((uint8_t *)local_358._8_8_ + local_330)) goto LAB_0010775c;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_338,0,(char *)0x0,local_358._0_8_);
      }
      else {
LAB_0010775c:
        puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)local_358,(ulong)local_338);
      }
      local_310._0_8_ = (long)&local_310 + 0x10;
      __nbytes = puVar11 + 2;
      if ((size_type *)*puVar11 == __nbytes) {
        local_310.typeName._M_string_length = *__nbytes;
        local_310.typeName.field_2._M_allocated_capacity = puVar11[3];
      }
      else {
        local_310.typeName._M_string_length = *__nbytes;
        local_310._0_8_ = (size_type *)*puVar11;
      }
      local_310.typeName._M_dataplus._M_p = (pointer)puVar11[1];
      *puVar11 = __nbytes;
      puVar11[1] = 0;
      *(undefined1 *)__nbytes = 0;
      std::fstream::fstream(local_240,(string *)&local_310,_S_in|_S_bin);
      if ((size_type *)local_310._0_8_ != (size_type *)((long)&local_310 + 0x10U)) {
        operator_delete((void *)local_310._0_8_,local_310.typeName._M_string_length + 1);
      }
      if (local_338 != local_328) {
        operator_delete(local_338,(ulong)&local_328[0]->field_0x1);
      }
      if ((pointer)local_358._0_8_ != (pointer)(local_358 + 0x10)) {
        operator_delete((void *)local_358._0_8_,(ulong)(local_358._16_8_ + 1));
      }
      if ((long *)local_378._0_8_ != &local_368) {
        operator_delete((void *)local_378._0_8_,local_368 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
      }
      if (local_2d8 != local_2c8) {
        operator_delete(local_2d8,local_2c8[0] + 1);
      }
      ::file::file(&local_310);
      __fd = (int)local_240;
      ::file::read(&local_310,__fd,__buf,(size_t)__nbytes);
      if (0 < (int)local_310.numRecords) {
        iVar18 = local_310.numRecords + 1;
        __buf_00 = (void *)0x16;
        do {
          __nbytes_00 = (size_t)(byte)local_314;
          ::page::page(&local_378,'\0',(uint32_t)local_248,(byte)local_314);
          ::page::read(&local_378,__fd,__buf_00,__nbytes_00);
          ::page::getRecords((vector<record,_std::allocator<record>_> *)local_358,&local_378,
                             local_240,(int)__buf_00,(char)p_Var6[2]._M_color);
          std::vector<record,std::allocator<record>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<record*,std::vector<record,std::allocator<record>>>>
                    ((vector<record,std::allocator<record>> *)&local_298,
                     local_298.super__Vector_base<record,_std::allocator<record>_>._M_impl.
                     super__Vector_impl_data._M_finish,local_358._0_8_,local_358._8_8_);
          __buf_00 = (void *)(ulong)((int)__buf_00 + 0x800);
          std::vector<record,_std::allocator<record>_>::~vector
                    ((vector<record,_std::allocator<record>_> *)local_358);
          ::page::~page(&local_378);
          iVar18 = iVar18 + -1;
        } while (1 < iVar18);
      }
      uVar17 = local_310.nextFile;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310.typeName._M_dataplus._M_p != &local_310.typeName.field_2) {
        operator_delete(local_310.typeName._M_dataplus._M_p,
                        local_310.typeName.field_2._M_allocated_capacity + 1);
      }
      std::fstream::~fstream(local_240);
      prVar3 = local_298.super__Vector_base<record,_std::allocator<record>_>._M_impl.
               super__Vector_impl_data._M_finish;
      prVar16 = local_298.super__Vector_base<record,_std::allocator<record>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar17 != 0);
    poVar4 = (ostream *)local_260;
    if (local_298.super__Vector_base<record,_std::allocator<record>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_298.super__Vector_base<record,_std::allocator<record>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar14 = ((long)local_298.super__Vector_base<record,_std::allocator<record>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_298.super__Vector_base<record,_std::allocator<record>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      lVar2 = 0x3f;
      if (uVar14 != 0) {
        for (; uVar14 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<record*,std::vector<record,std::allocator<record>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_298.super__Vector_base<record,_std::allocator<record>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_298.super__Vector_base<record,_std::allocator<record>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<record*,std::vector<record,std::allocator<record>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (prVar16,prVar3);
      prVar16 = local_298.super__Vector_base<record,_std::allocator<record>_>._M_impl.
                super__Vector_impl_data._M_start;
      prVar3 = local_298.super__Vector_base<record,_std::allocator<record>_>._M_impl.
               super__Vector_impl_data._M_finish;
      poVar4 = (ostream *)local_260;
    }
    for (; this_00 = local_260,
        prVar5 = local_298.super__Vector_base<record,_std::allocator<record>_>._M_impl.
                 super__Vector_impl_data._M_finish, local_260 = (ostream *)poVar4,
        prVar16 !=
        local_298.super__Vector_base<record,_std::allocator<record>_>._M_impl.
        super__Vector_impl_data._M_finish; prVar16 = prVar16 + 1) {
      local_298.super__Vector_base<record,_std::allocator<record>_>._M_impl.super__Vector_impl_data.
      _M_finish = prVar3;
      if (prVar16->numFields != '\0') {
        uVar14 = 0;
        do {
          poVar13 = (ostream *)std::ostream::operator<<((ostream *)this_00,prVar16->fields[uVar14]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
          uVar14 = uVar14 + 1;
        } while (uVar14 < prVar16->numFields);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)this_00 + -0x18) + (char)this_00);
      std::ostream::put((char)this_00);
      std::ostream::flush();
      prVar3 = local_298.super__Vector_base<record,_std::allocator<record>_>._M_impl.
               super__Vector_impl_data._M_finish;
      poVar4 = (ostream *)local_260;
      local_260 = this_00;
      local_298.super__Vector_base<record,_std::allocator<record>_>._M_impl.super__Vector_impl_data.
      _M_finish = prVar5;
    }
    local_298.super__Vector_base<record,_std::allocator<record>_>._M_impl.super__Vector_impl_data.
    _M_finish = prVar3;
    std::vector<record,_std::allocator<record>_>::~vector(&local_298);
  }
  return;
}

Assistant:

void dml::listRecords(string typeName, ostream &stream) {
    auto type = systemCatalog->getType(typeName);

    if(type == systemCatalog->types.end()) { return; }

    auto records = vector<record>(0);

    int currFileLink = 1;

    auto recordSize = (uint8_t) (RECORD_ID + type->numFields * FIELD);

    auto slotSize = (uint8_t) min((PAGE - PAGE_ID - NUM_RECORDS) / (recordSize+ 1), 255);

    do {
        fstream currFile(ROOT + truncateName(typeName) + INFIX + to_string(currFileLink), INBIN);

        file file;
        file.read(currFile);

        int offset = IS_FULL + TYPE_NAME + NUM_PAGES + NUM_RECORDS + LINK_TO_FILE + LINK_TO_FILE;

        for (int i = file.numRecords; i > 0; --i) {
            page page(0, recordSize, slotSize);

            page.read(currFile, offset);

            vector<record> pageRecords = page.getRecords(currFile, offset, type->numFields);

            records.insert(records.end(), pageRecords.begin(), pageRecords.end());

            offset += PAGE;
        }

        currFileLink = file.nextFile;
    } while(currFileLink != 0);

    sort(records.begin(), records.end());

    for (const auto &record: records) {

        for (int i = 0; i < record.numFields; ++i) {
            stream << record.fields[i] << " ";
        }

        stream << endl;
    }
}